

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::WakeUpLocalWorkerThread
          (CPalSynchronizationManager *this,SynchWorkerCmd swcWorkerCmd)

{
  int iVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  undefined8 uStack_38;
  BYTE byCmd;
  
  uStack_38 = in_RAX;
  if (0xff < swcWorkerCmd) {
    fprintf(_stderr,"] %s %s:%d","WakeUpLocalWorkerThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x9e8);
    fprintf(_stderr,
            "Expression: (swcWorkerCmd & 0xFF) == swcWorkerCmd, Description: Value too big for swcWorkerCmd\n"
           );
  }
  if ((swcWorkerCmd != SynchWorkerCmdNop) && (swcWorkerCmd != SynchWorkerCmdShutdown)) {
    fprintf(_stderr,"] %s %s:%d","WakeUpLocalWorkerThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x9ed);
    fprintf(_stderr,
            "Expression: (SynchWorkerCmdNop == swcWorkerCmd) || (SynchWorkerCmdShutdown == swcWorkerCmd), Description: WakeUpLocalWorkerThread supports only SynchWorkerCmdNop and SynchWorkerCmdShutdown  [received cmd=%d]\n"
            ,(ulong)swcWorkerCmd);
  }
  uStack_38 = CONCAT17((char)swcWorkerCmd,(undefined7)uStack_38);
  if (PAL_InitializeChakraCoreCalled == true) {
    iVar4 = 0x7f;
    while (sVar2 = write(this->m_iProcessPipeWrite,(void *)((long)&uStack_38 + 7),1), sVar2 == -1) {
      piVar3 = __errno_location();
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (((*piVar3 != 0xb) || (bVar5)) || (iVar1 = sched_yield(), iVar1 != 0)) goto LAB_0020165a;
    }
    if (sVar2 == 1) {
      return 0;
    }
LAB_0020165a:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar3 = __errno_location();
      strerror(*piVar3);
      return 0x54f;
    }
  }
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::WakeUpLocalWorkerThread(
        SynchWorkerCmd swcWorkerCmd)
    {
        PAL_ERROR palErr = NO_ERROR;
        ssize_t sszWritten;
        BYTE byCmd;
        int iRetryCount;

        _ASSERT_MSG((swcWorkerCmd & 0xFF) == swcWorkerCmd,
                    "Value too big for swcWorkerCmd\n");
        _ASSERT_MSG((SynchWorkerCmdNop == swcWorkerCmd) ||
                    (SynchWorkerCmdShutdown == swcWorkerCmd),
                    "WakeUpLocalWorkerThread supports only "
                    "SynchWorkerCmdNop and SynchWorkerCmdShutdown  "
                    "[received cmd=%d]\n", swcWorkerCmd);

        byCmd = (BYTE)(swcWorkerCmd & 0xFF);

        TRACE("Waking up Synch Worker Thread for %u [byCmd=%u]\n",
                    swcWorkerCmd, (unsigned int)byCmd);

        // As long as we use pipes and we keep the message size
        // within PIPE_BUF, there's no need to lock here, since the
        // write is guaranteed not to be interleaved with/into other
        // writes of PIPE_BUF bytes or less.
        _ASSERT_MSG(sizeof(BYTE) <= PIPE_BUF, "Message too long\n");

        iRetryCount = 0;
        do
        {
            sszWritten = write(m_iProcessPipeWrite, &byCmd, sizeof(BYTE));
        } while (-1 == sszWritten &&
                 EAGAIN == errno &&
                 ++iRetryCount < MaxConsecutiveEagains &&
                 0 == sched_yield());

        if (sszWritten != sizeof(BYTE))
        {
            ERROR("Unable to write the the process pipe to wakeup the "
                   "worker thread [errno=%d (%s)]\n", errno, strerror(errno));
            palErr = ERROR_INTERNAL_ERROR;
            goto WUWT_exit;
        }

    WUWT_exit:
        return palErr;
    }